

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkAllocVec(ARKodeMem ark_mem,N_Vector tmpl,N_Vector *v)

{
  long lVar1;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  int local_4;
  
  if ((*(long *)(*(long *)(in_RSI + 8) + 8) == 0) || (*(long *)(*(long *)(in_RSI + 8) + 0x18) == 0))
  {
    local_4 = 0;
  }
  else {
    if (*in_RDX == 0) {
      lVar1 = N_VClone(in_RSI);
      *in_RDX = lVar1;
      if (*in_RDX == 0) {
        arkFreeVectors((ARKodeMem)0x19df45);
        return 0;
      }
      *(long *)(in_RDI + 0x368) = *(long *)(in_RDI + 0x358) + *(long *)(in_RDI + 0x368);
      *(long *)(in_RDI + 0x370) = *(long *)(in_RDI + 0x360) + *(long *)(in_RDI + 0x370);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

sunbooleantype arkAllocVec(ARKodeMem ark_mem, N_Vector tmpl, N_Vector* v)
{
  /* return failure if N_VClone or N_VDestroy is not implemented */
  if ((!tmpl->ops->nvclone) || (!tmpl->ops->nvdestroy)) { return SUNFALSE; }

  /* allocate the new vector if necessary */
  if (*v == NULL)
  {
    *v = N_VClone(tmpl);
    if (*v == NULL)
    {
      arkFreeVectors(ark_mem);
      return (SUNFALSE);
    }
    else
    {
      ark_mem->lrw += ark_mem->lrw1;
      ark_mem->liw += ark_mem->liw1;
    }
  }
  return (SUNTRUE);
}